

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cpp
# Opt level: O2

int ParseExpMinMax(char **p,aint *nval)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int local_44;
  aint right;
  int local_3c;
  aint *local_38;
  
  iVar1 = ParseExpShift(p,&local_3c);
  if (iVar1 == 0) {
LAB_0011f3f2:
    iVar1 = 0;
  }
  else {
    local_44 = local_3c;
    iVar1 = 1;
    local_38 = nval;
    while (iVar2 = need(p,"<?>?"), iVar2 != 0) {
      iVar3 = ParseExpShift(p,&right);
      if (iVar3 == 0) goto LAB_0011f3f2;
      if (iVar2 == 0x7d) {
        if (local_44 <= right) {
          local_44 = right;
        }
      }
      else if (iVar2 == 0x7b) {
        if (right <= local_44) {
          local_44 = right;
        }
      }
      else {
        Error("internal error",(char *)0x0,FATAL);
      }
    }
    *local_38 = local_44;
  }
  return iVar1;
}

Assistant:

static int ParseExpMinMax(char*& p, aint& nval) {
	aint left, right;
	int oper;
	if (!ParseExpShift(p, left)) return 0;
	while ((oper = need(p, "<?>?"))) {
		if (!ParseExpShift(p, right)) return 0;
		switch (oper) {
		case '<'+'?':
			left = left < right ? left : right; break;
		case '>'+'?':
			left = left > right ? left : right; break;
		default: Error("internal error", nullptr, FATAL); break;	// unreachable
		}
	}
	nval = left;
	return 1;
}